

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

quint64 __thiscall QCss::Selector::pseudoClass(Selector *this,quint64 *negated)

{
  BasicSelector *pBVar1;
  long lVar2;
  Pseudo *pPVar3;
  ulong uVar4;
  quint64 qVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar1 = (this->basicSelectors).d.ptr;
  lVar2 = (this->basicSelectors).d.size;
  if (pBVar1[lVar2 + -1].pseudos.d.size == 0) {
    qVar5 = 0x100;
  }
  else {
    pseudoElement((QString *)&local_40,this);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    lVar6 = (ulong)(local_40.size != 0) << 6;
    qVar5 = 0;
    for (uVar7 = (ulong)(local_40.size != 0); uVar7 < (ulong)pBVar1[lVar2 + -1].pseudos.d.size;
        uVar7 = uVar7 + 1) {
      pPVar3 = pBVar1[lVar2 + -1].pseudos.d.ptr;
      uVar4 = *(ulong *)((long)&pPVar3->type + lVar6);
      if (uVar4 == 0) {
        qVar5 = 0;
        break;
      }
      if ((&pPVar3->negated)[lVar6] == false) {
        qVar5 = qVar5 | uVar4;
      }
      else if (negated != (quint64 *)0x0) {
        *negated = *negated | uVar4;
      }
      lVar6 = lVar6 + 0x40;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return qVar5;
  }
  __stack_chk_fail();
}

Assistant:

quint64 Selector::pseudoClass(quint64 *negated) const
{
    const BasicSelector& bs = basicSelectors.last();
    if (bs.pseudos.isEmpty())
        return PseudoClass_Unspecified;
    quint64 pc = PseudoClass_Unknown;
    for (int i = !pseudoElement().isEmpty(); i < bs.pseudos.size(); i++) {
        const Pseudo &pseudo = bs.pseudos.at(i);
        if (pseudo.type == PseudoClass_Unknown)
            return PseudoClass_Unknown;
        if (!pseudo.negated)
            pc |= pseudo.type;
        else if (negated)
            *negated |= pseudo.type;
    }
    return pc;
}